

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O3

FT_Error af_latin_hints_apply
                   (FT_UInt glyph_index,AF_GlyphHints hints,FT_Outline *outline,
                   AF_LatinMetrics metrics)

{
  FT_Pos FVar1;
  uint uVar2;
  FT_Error FVar3;
  AF_Edge_conflict pAVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  AF_Edge_conflict pAVar8;
  AF_Point_conflict pAVar9;
  long lVar10;
  AF_Point_conflict pAVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  FT_Vector *pFVar18;
  char *pcVar19;
  uint uVar20;
  AF_Width pAVar21;
  byte bVar22;
  AF_Width pAVar23;
  ulong uVar24;
  int iVar25;
  
  uVar2 = af_glyph_hints_reload(hints,outline);
  if (uVar2 == 0) {
    uVar2 = hints->scaler_flags;
    if ((uVar2 & 1) == 0) {
      FVar3 = af_latin_hints_detect_features
                        (hints,metrics->axis[0].width_count,metrics->axis[0].widths,
                         AF_DIMENSION_HORZ);
      if (FVar3 != 0) {
        return FVar3;
      }
      uVar2 = hints->scaler_flags;
    }
    if ((uVar2 & 2) == 0) {
      FVar3 = af_latin_hints_detect_features
                        (hints,metrics->axis[1].width_count,metrics->axis[1].widths,
                         AF_DIMENSION_VERT);
      if (FVar3 != 0) {
        return FVar3;
      }
      if ((((*(byte *)((long)((metrics->root).globals)->glyph_styles + (ulong)glyph_index * 2 + 1) &
            0x40) == 0) && (pAVar4 = hints->axis[1].edges, pAVar4 != (AF_Edge_conflict)0x0)) &&
         (uVar7 = (ulong)hints->axis[1].num_edges, uVar7 != 0)) {
        pAVar8 = pAVar4 + uVar7;
        lVar10 = (long)(int)metrics->axis[1].scale;
        lVar16 = ((ulong)metrics->units_per_em / 0x28) * lVar10;
        iVar5 = (int)((ulong)((lVar16 >> 0x3f) + lVar16 + 0x8000) >> 0x10);
        iVar15 = 0x20;
        if (iVar5 < 0x20) {
          iVar15 = iVar5;
        }
        uVar7 = (ulong)metrics->axis[1].blue_count;
        do {
          if (uVar7 != 0) {
            pAVar21 = (AF_Width)0x0;
            bVar22 = 0;
            pAVar23 = &metrics->axis[1].blues[0].ref;
            uVar24 = uVar7;
            iVar5 = iVar15;
            do {
              uVar2 = *(uint *)&pAVar23[2].fit;
              if ((uVar2 & 1) != 0) {
                uVar20 = uVar2 >> 3;
                if (((uVar20 & 1) != 0) ||
                   (((uVar2 & 6) != 0) != (hints->axis[1].major_dir == (int)pAVar4->dir))) {
                  lVar17 = (long)pAVar4->fpos;
                  lVar16 = ((AF_WidthRec *)&pAVar23->org)->org;
                  lVar12 = lVar17 - lVar16;
                  lVar13 = -lVar12;
                  if (0 < lVar12) {
                    lVar13 = lVar12;
                  }
                  lVar13 = (int)lVar13 * lVar10;
                  uVar14 = lVar13 + (lVar13 >> 0x3f) + 0x8000;
                  iVar6 = (int)(uVar14 >> 0x10);
                  iVar25 = iVar6;
                  if (iVar5 < iVar6) {
                    iVar25 = iVar5;
                  }
                  if (iVar6 < iVar5) {
                    pAVar21 = pAVar23;
                    bVar22 = (byte)uVar20 & 1;
                  }
                  iVar5 = iVar25;
                  if ((((uVar20 & 1) == 0) && (((uVar2 & 6) != 0) == lVar16 <= lVar17)) &&
                     (((pAVar4->flags & 1) != 0 && ((uVar14 & 0xffffffff0000) != 0)))) {
                    lVar17 = lVar17 - pAVar23[1].org;
                    lVar16 = -lVar17;
                    if (0 < lVar17) {
                      lVar16 = lVar17;
                    }
                    lVar16 = (int)lVar16 * lVar10;
                    iVar6 = (int)((ulong)(lVar16 + (lVar16 >> 0x3f) + 0x8000) >> 0x10);
                    if (iVar6 < iVar25) {
                      pAVar21 = pAVar23 + 1;
                      bVar22 = 0;
                      iVar5 = iVar6;
                    }
                  }
                }
              }
              pAVar23 = pAVar23 + 3;
              uVar24 = uVar24 - 1;
            } while (uVar24 != 0);
            if ((pAVar21 != (AF_Width)0x0) && (pAVar4->blue_edge = pAVar21, bVar22 != 0)) {
              pAVar4->flags = pAVar4->flags | 8;
            }
          }
          pAVar4 = pAVar4 + 1;
        } while (pAVar4 < pAVar8);
      }
    }
    if ((hints->scaler_flags & 1) == 0) {
      af_latin_hint_edges(hints,AF_DIMENSION_HORZ);
      af_glyph_hints_align_edge_points(hints,AF_DIMENSION_HORZ);
      af_glyph_hints_align_strong_points(hints,AF_DIMENSION_HORZ);
      af_glyph_hints_align_weak_points(hints,AF_DIMENSION_HORZ);
    }
    if ((hints->scaler_flags & 2) == 0) {
      af_latin_hint_edges(hints,AF_DIMENSION_VERT);
      af_glyph_hints_align_edge_points(hints,AF_DIMENSION_VERT);
      af_glyph_hints_align_strong_points(hints,AF_DIMENSION_VERT);
      af_glyph_hints_align_weak_points(hints,AF_DIMENSION_VERT);
    }
    if ((long)hints->num_points < 1) {
      uVar2 = 0;
    }
    else {
      pAVar9 = hints->points;
      pAVar11 = pAVar9 + hints->num_points;
      pFVar18 = outline->points;
      pcVar19 = outline->tags;
      do {
        FVar1 = pAVar9->y;
        pFVar18->x = pAVar9->x;
        pFVar18->y = FVar1;
        uVar2 = 0;
        uVar20 = (uint)(byte)(2 - ((pAVar9->flags & 2) == 0));
        if ((pAVar9->flags & 1) != 0) {
          uVar20 = uVar2;
        }
        *pcVar19 = (char)uVar20;
        pAVar9 = pAVar9 + 1;
        pFVar18 = pFVar18 + 1;
        pcVar19 = pcVar19 + 1;
      } while (pAVar9 < pAVar11);
    }
  }
  return uVar2;
}

Assistant:

static FT_Error
  af_latin_hints_apply( FT_UInt          glyph_index,
                        AF_GlyphHints    hints,
                        FT_Outline*      outline,
                        AF_LatinMetrics  metrics )
  {
    FT_Error  error;
    int       dim;

    AF_LatinAxis  axis;


    error = af_glyph_hints_reload( hints, outline );
    if ( error )
      goto Exit;

    /* analyze glyph outline */
    if ( AF_HINTS_DO_HORIZONTAL( hints ) )
    {
      axis  = &metrics->axis[AF_DIMENSION_HORZ];
      error = af_latin_hints_detect_features( hints,
                                              axis->width_count,
                                              axis->widths,
                                              AF_DIMENSION_HORZ );
      if ( error )
        goto Exit;
    }

    if ( AF_HINTS_DO_VERTICAL( hints ) )
    {
      axis  = &metrics->axis[AF_DIMENSION_VERT];
      error = af_latin_hints_detect_features( hints,
                                              axis->width_count,
                                              axis->widths,
                                              AF_DIMENSION_VERT );
      if ( error )
        goto Exit;

      /* apply blue zones to base characters only */
      if ( !( metrics->root.globals->glyph_styles[glyph_index] & AF_NONBASE ) )
        af_latin_hints_compute_blue_edges( hints, metrics );
    }

    /* grid-fit the outline */
    for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
    {
      if ( ( dim == AF_DIMENSION_HORZ && AF_HINTS_DO_HORIZONTAL( hints ) ) ||
           ( dim == AF_DIMENSION_VERT && AF_HINTS_DO_VERTICAL( hints ) )   )
      {
        af_latin_hint_edges( hints, (AF_Dimension)dim );
        af_glyph_hints_align_edge_points( hints, (AF_Dimension)dim );
        af_glyph_hints_align_strong_points( hints, (AF_Dimension)dim );
        af_glyph_hints_align_weak_points( hints, (AF_Dimension)dim );
      }
    }

    af_glyph_hints_save( hints, outline );

  Exit:
    return error;
  }